

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O2

void __thiscall hgdb::rtl::Serializer::handle(Serializer *this,CaseStatement *stmt)

{
  Expression *pEVar1;
  pointer ppEVar2;
  size_type __n;
  pointer pbVar3;
  pointer pIVar4;
  Statement *stmt_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar6;
  pointer pIVar7;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_str;
  undefined1 local_258 [40];
  string *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_conditions;
  string *local_1f8;
  code *local_1f0;
  string target_str;
  ExpressionPrinter p;
  
  pEVar1 = stmt->expr;
  target_str._M_dataplus._M_p = (pointer)&target_str.field_2;
  target_str._M_string_length = 0;
  target_str.field_2._M_local_buf[0] = '\0';
  local_258._0_8_ = (pEVar1->sourceRange).startLoc;
  p.loc_ = (SourceLocation *)local_258;
  std::__cxx11::stringstream::stringstream((stringstream *)&p.ss_);
  slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(pEVar1,&p);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&target_str,(string *)local_258);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::stringstream::~stringstream((stringstream *)&p.ss_);
  all_conditions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_conditions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_conditions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar7 = (stmt->items).data_;
  pIVar4 = pIVar7 + (stmt->items).size_;
  local_230 = (string *)&this->current_condition_;
  for (; pbVar3 = all_conditions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pIVar7 != pIVar4; pIVar7 = pIVar7 + 1)
  {
    ppEVar2 = (pIVar7->expressions).data_;
    __n = (pIVar7->expressions).size_;
    values_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    values_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&values_str,__n);
    for (lVar5 = 0;
        pbVar3 = values_str.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pbVar6 = values_str.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, __n << 3 != lVar5; lVar5 = lVar5 + 8) {
      pEVar1 = *(Expression **)((long)ppEVar2 + lVar5);
      if (pEVar1 != (Expression *)0x0) {
        local_258._0_8_ = (pEVar1->sourceRange).startLoc;
        p.loc_ = (SourceLocation *)local_258;
        std::__cxx11::stringstream::stringstream((stringstream *)&p.ss_);
        slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(pEVar1,&p);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&values_str,
                   (string *)local_258);
        std::__cxx11::string::~string((string *)local_258);
        if (stmt->defaultCase != (Statement *)0x0) {
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &all_conditions,(string *)local_258);
          std::__cxx11::string::~string((string *)local_258);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&p.ss_);
      }
    }
    for (; pbVar6 != pbVar3; pbVar6 = pbVar6 + 1) {
      p._16_8_ = (pbVar6->_M_dataplus)._M_p;
      p._24_8_ = pbVar6->_M_string_length;
      p.loc_ = (SourceLocation *)target_str._M_dataplus._M_p;
      p._8_8_ = target_str._M_string_length;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&p;
      fmt.size_ = 0xdd;
      fmt.data_ = (char *)0xc;
      ::fmt::v9::vformat_abi_cxx11_((string *)local_258,(v9 *)"({0} == {1})",fmt,args);
      std::__cxx11::string::operator=((string *)pbVar6,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
    }
    local_258._0_8_ =
         values_str.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_258._8_8_ =
         values_str.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_258._16_8_ = " && ";
    local_258._24_8_ = 4;
    local_1f0 = ::fmt::v9::detail::value<fmt::v9::basic_format_context<fmt::v9::appender,char>>::
                format_custom_arg<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v9::formatter<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
    ;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_1f8;
    fmt_00.size_ = 0xf;
    fmt_00.data_ = (char *)0x3;
    local_1f8 = (string *)local_258;
    ::fmt::v9::vformat_abi_cxx11_((string *)&p,(v9 *)0x33a877,fmt_00,args_00);
    std::__cxx11::string::operator=(local_230,(string *)&p);
    std::__cxx11::string::~string((string *)&p);
    stmt_00 = slang::not_null<const_slang::ast::Statement_*>::get(&pIVar7->stmt);
    visit_block_stmt(this,stmt_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&values_str);
  }
  if (stmt->defaultCase != (Statement *)0x0) {
    for (pbVar6 = all_conditions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar3; pbVar6 = pbVar6 + 1)
    {
      p._16_8_ = (pbVar6->_M_dataplus)._M_p;
      p._24_8_ = pbVar6->_M_string_length;
      p.loc_ = (SourceLocation *)target_str._M_dataplus._M_p;
      p._8_8_ = target_str._M_string_length;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&p;
      fmt_01.size_ = 0xdd;
      fmt_01.data_ = (char *)0xc;
      ::fmt::v9::vformat_abi_cxx11_((string *)local_258,(v9 *)"({0} != {1})",fmt_01,args_01);
      std::__cxx11::string::operator=((string *)pbVar6,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
    }
    local_258._0_8_ =
         all_conditions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_258._8_8_ =
         all_conditions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_258._16_8_ = " && ";
    local_258._24_8_ = 4;
    values_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)::fmt::v9::detail::value<fmt::v9::basic_format_context<fmt::v9::appender,char>>::
                  format_custom_arg<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v9::formatter<fmt::v9::join_view<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
    ;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)&values_str;
    fmt_02.size_ = 0xf;
    fmt_02.data_ = (char *)0x3;
    values_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)local_258;
    ::fmt::v9::vformat_abi_cxx11_((string *)&p,(v9 *)0x33a877,fmt_02,args_02);
    std::__cxx11::string::operator=(local_230,(string *)&p);
    std::__cxx11::string::~string((string *)&p);
    visit_block_stmt(this,stmt->defaultCase);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_conditions);
  std::__cxx11::string::~string((string *)&target_str);
  return;
}

Assistant:

void handle(const slang::ast::CaseStatement &stmt) {
        auto const &target = stmt.expr;
        std::string target_str;
        {
            ExpressionPrinter p(target.sourceRange.start());
            target.visit(p);
            target_str = p.str();
        }

        std::vector<std::string> all_conditions;

        for (auto const &case_ : stmt.items) {
            auto values = case_.expressions;
            std::vector<std::string> values_str;
            values_str.reserve(values.size());
            for (auto *e : values) {
                if (e) {
                    ExpressionPrinter p(e->sourceRange.start());
                    e->visit(p);
                    values_str.emplace_back(p.str());
                    if (stmt.defaultCase) {
                        all_conditions.emplace_back(p.str());
                    }
                }
            }
            for (auto &s : values_str) {
                s = fmt::format("({0} == {1})", target_str, s);
            }
            current_condition_ =
                fmt::format("{0}", fmt::join(values_str.begin(), values_str.end(), " && "));
            visit_block_stmt(case_.stmt);
        }

        if (stmt.defaultCase) {
            for (auto &s : all_conditions) {
                s = fmt::format("({0} != {1})", target_str, s);
            }
            current_condition_ =
                fmt::format("{0}", fmt::join(all_conditions.begin(), all_conditions.end(), " && "));
            visit_block_stmt(stmt.defaultCase);
        }
    }